

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_mask_sx_sy_w16n_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  char cVar4;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uint8_t *puVar22;
  long lVar23;
  short sVar24;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  undefined1 auVar25 [16];
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar56 [16];
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  
  auVar21 = _DAT_0046ea70;
  auVar20 = _DAT_0042a3c0;
  puVar22 = mask + (ulong)mask_stride + 0x10;
  do {
    for (lVar23 = 0; lVar23 < w; lVar23 = lVar23 + 0x10) {
      puVar1 = mask + lVar23 * 2;
      puVar2 = mask + lVar23 * 2 + 0x10;
      puVar3 = puVar22 + lVar23 * 2 + -0x10;
      auVar43[0] = *puVar3 + *puVar1;
      auVar43[1] = puVar3[1] + puVar1[1];
      auVar43[2] = puVar3[2] + puVar1[2];
      auVar43[3] = puVar3[3] + puVar1[3];
      auVar43[4] = puVar3[4] + puVar1[4];
      auVar43[5] = puVar3[5] + puVar1[5];
      auVar43[6] = puVar3[6] + puVar1[6];
      auVar43[7] = puVar3[7] + puVar1[7];
      auVar43[8] = puVar3[8] + puVar1[8];
      auVar43[9] = puVar3[9] + puVar1[9];
      auVar43[10] = puVar3[10] + puVar1[10];
      auVar43[0xb] = puVar3[0xb] + puVar1[0xb];
      auVar43[0xc] = puVar3[0xc] + puVar1[0xc];
      auVar43[0xd] = puVar3[0xd] + puVar1[0xd];
      auVar43[0xe] = puVar3[0xe] + puVar1[0xe];
      auVar43[0xf] = puVar3[0xf] + puVar1[0xf];
      puVar1 = puVar22 + lVar23 * 2;
      auVar47[0] = *puVar1 + *puVar2;
      auVar47[1] = puVar1[1] + puVar2[1];
      auVar47[2] = puVar1[2] + puVar2[2];
      auVar47[3] = puVar1[3] + puVar2[3];
      auVar47[4] = puVar1[4] + puVar2[4];
      auVar47[5] = puVar1[5] + puVar2[5];
      auVar47[6] = puVar1[6] + puVar2[6];
      auVar47[7] = puVar1[7] + puVar2[7];
      auVar47[8] = puVar1[8] + puVar2[8];
      auVar47[9] = puVar1[9] + puVar2[9];
      auVar47[10] = puVar1[10] + puVar2[10];
      auVar47[0xb] = puVar1[0xb] + puVar2[0xb];
      auVar47[0xc] = puVar1[0xc] + puVar2[0xc];
      auVar47[0xd] = puVar1[0xd] + puVar2[0xd];
      auVar47[0xe] = puVar1[0xe] + puVar2[0xe];
      auVar47[0xf] = puVar1[0xf] + puVar2[0xf];
      auVar25 = pshufb(auVar43,ZEXT816(0xe0c0a0806040200));
      auVar44 = pshufb(auVar43,ZEXT816(0xf0d0b0907050301));
      auVar41 = auVar44 & auVar25;
      auVar44 = auVar44 ^ auVar25;
      auVar45._0_2_ = auVar44._0_2_ >> 1;
      auVar45._2_2_ = auVar44._2_2_ >> 1;
      auVar45._4_2_ = auVar44._4_2_ >> 1;
      auVar45._6_2_ = auVar44._6_2_ >> 1;
      auVar45._8_2_ = auVar44._8_2_ >> 1;
      auVar45._10_2_ = auVar44._10_2_ >> 1;
      auVar45._12_2_ = auVar44._12_2_ >> 1;
      auVar45._14_2_ = auVar44._14_2_ >> 1;
      auVar45 = auVar45 & auVar20;
      auVar46[0] = auVar45[0] + auVar41[0];
      auVar46[1] = auVar45[1] + auVar41[1];
      auVar46[2] = auVar45[2] + auVar41[2];
      auVar46[3] = auVar45[3] + auVar41[3];
      auVar46[4] = auVar45[4] + auVar41[4];
      auVar46[5] = auVar45[5] + auVar41[5];
      auVar46[6] = auVar45[6] + auVar41[6];
      auVar46[7] = auVar45[7] + auVar41[7];
      auVar46[8] = auVar45[8] + auVar41[8];
      auVar46[9] = auVar45[9] + auVar41[9];
      auVar46[10] = auVar45[10] + auVar41[10];
      auVar46[0xb] = auVar45[0xb] + auVar41[0xb];
      auVar46[0xc] = auVar45[0xc] + auVar41[0xc];
      auVar46[0xd] = auVar45[0xd] + auVar41[0xd];
      auVar46[0xe] = auVar45[0xe] + auVar41[0xe];
      auVar46[0xf] = auVar45[0xf] + auVar41[0xf];
      auVar25 = pmovzxbw(auVar25,auVar46);
      sVar24 = pavgw(auVar25._0_2_,0);
      sVar26 = pavgw(auVar25._2_2_,0);
      sVar27 = pavgw(auVar25._4_2_,0);
      sVar28 = pavgw(auVar25._6_2_,0);
      sVar29 = pavgw(auVar25._8_2_,0);
      sVar30 = pavgw(auVar25._10_2_,0);
      sVar31 = pavgw(auVar25._12_2_,0);
      sVar32 = pavgw(auVar25._14_2_,0);
      auVar41 = pshufb(auVar47,ZEXT816(0xe0c0a0806040200));
      auVar25 = pshufb(auVar47,ZEXT816(0xf0d0b0907050301));
      auVar47 = auVar25 & auVar41;
      auVar25 = auVar25 ^ auVar41;
      auVar41._0_2_ = auVar25._0_2_ >> 1;
      auVar41._2_2_ = auVar25._2_2_ >> 1;
      auVar41._4_2_ = auVar25._4_2_ >> 1;
      auVar41._6_2_ = auVar25._6_2_ >> 1;
      auVar41._8_2_ = auVar25._8_2_ >> 1;
      auVar41._10_2_ = auVar25._10_2_ >> 1;
      auVar41._12_2_ = auVar25._12_2_ >> 1;
      auVar41._14_2_ = auVar25._14_2_ >> 1;
      auVar41 = auVar41 & auVar20;
      auVar44[0] = auVar41[0] + auVar47[0];
      auVar44[1] = auVar41[1] + auVar47[1];
      auVar44[2] = auVar41[2] + auVar47[2];
      auVar44[3] = auVar41[3] + auVar47[3];
      auVar44[4] = auVar41[4] + auVar47[4];
      auVar44[5] = auVar41[5] + auVar47[5];
      auVar44[6] = auVar41[6] + auVar47[6];
      auVar44[7] = auVar41[7] + auVar47[7];
      auVar44[8] = auVar41[8] + auVar47[8];
      auVar44[9] = auVar41[9] + auVar47[9];
      auVar44[10] = auVar41[10] + auVar47[10];
      auVar44[0xb] = auVar41[0xb] + auVar47[0xb];
      auVar44[0xc] = auVar41[0xc] + auVar47[0xc];
      auVar44[0xd] = auVar41[0xd] + auVar47[0xd];
      auVar44[0xe] = auVar41[0xe] + auVar47[0xe];
      auVar44[0xf] = auVar41[0xf] + auVar47[0xf];
      auVar25 = pmovzxbw(auVar44,auVar44);
      sVar33 = pavgw(auVar25._0_2_,0);
      sVar34 = pavgw(auVar25._2_2_,0);
      sVar35 = pavgw(auVar25._4_2_,0);
      sVar36 = pavgw(auVar25._6_2_,0);
      sVar37 = pavgw(auVar25._8_2_,0);
      sVar38 = pavgw(auVar25._10_2_,0);
      sVar39 = pavgw(auVar25._12_2_,0);
      sVar40 = pavgw(auVar25._14_2_,0);
      cVar4 = (0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24);
      cVar5 = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26);
      cVar6 = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
      cVar7 = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
      cVar8 = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
      cVar9 = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
      cVar10 = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
      cVar11 = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
      cVar12 = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
      cVar13 = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
      cVar14 = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
      cVar15 = (0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36);
      cVar16 = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
      cVar17 = (0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38);
      cVar18 = (0 < sVar39) * (sVar39 < 0x100) * (char)sVar39 - (0xff < sVar39);
      cVar19 = (0 < sVar40) * (sVar40 < 0x100) * (char)sVar40 - (0xff < sVar40);
      auVar25 = *(undefined1 (*) [16])(src0 + lVar23);
      puVar1 = src1 + lVar23;
      auVar55._0_14_ = auVar25._0_14_;
      auVar55[0xe] = auVar25[7];
      auVar55[0xf] = puVar1[7];
      auVar54._14_2_ = auVar55._14_2_;
      auVar54._0_13_ = auVar25._0_13_;
      auVar54[0xd] = puVar1[6];
      auVar53._13_3_ = auVar54._13_3_;
      auVar53._0_12_ = auVar25._0_12_;
      auVar53[0xc] = auVar25[6];
      auVar52._12_4_ = auVar53._12_4_;
      auVar52._0_11_ = auVar25._0_11_;
      auVar52[0xb] = puVar1[5];
      auVar51._11_5_ = auVar52._11_5_;
      auVar51._0_10_ = auVar25._0_10_;
      auVar51[10] = auVar25[5];
      auVar50._10_6_ = auVar51._10_6_;
      auVar50._0_9_ = auVar25._0_9_;
      auVar50[9] = puVar1[4];
      auVar49._9_7_ = auVar50._9_7_;
      auVar49._0_8_ = auVar25._0_8_;
      auVar49[8] = auVar25[4];
      auVar48._8_8_ = auVar49._8_8_;
      auVar48[7] = puVar1[3];
      auVar48[6] = auVar25[3];
      auVar48[5] = puVar1[2];
      auVar48[4] = auVar25[2];
      auVar48[3] = puVar1[1];
      auVar48[2] = auVar25[1];
      auVar48[0] = auVar25[0];
      auVar48[1] = *puVar1;
      auVar56._8_8_ =
           (undefined8)
           (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11('@' - cVar11,cVar11),
                                                                  '@' - cVar10),cVar10),'@' - cVar9)
                                       ,cVar9),'@' - cVar8),CONCAT11(cVar8,cVar11)) >> 8);
      auVar56[7] = '@' - cVar7;
      auVar56[6] = cVar7;
      auVar56[5] = '@' - cVar6;
      auVar56[4] = cVar6;
      auVar56[3] = '@' - cVar5;
      auVar56[2] = cVar5;
      auVar56[1] = '@' - cVar4;
      auVar56[0] = cVar4;
      auVar47 = pmaddubsw(auVar48,auVar56);
      auVar42[1] = puVar1[8];
      auVar42[0] = auVar25[8];
      auVar42[2] = auVar25[9];
      auVar42[3] = puVar1[9];
      auVar42[4] = auVar25[10];
      auVar42[5] = puVar1[10];
      auVar42[6] = auVar25[0xb];
      auVar42[7] = puVar1[0xb];
      auVar42[8] = auVar25[0xc];
      auVar42[9] = puVar1[0xc];
      auVar42[10] = auVar25[0xd];
      auVar42[0xb] = puVar1[0xd];
      auVar42[0xc] = auVar25[0xe];
      auVar42[0xd] = puVar1[0xe];
      auVar42[0xe] = auVar25[0xf];
      auVar42[0xf] = puVar1[0xf];
      auVar25[1] = '@' - cVar12;
      auVar25[0] = cVar12;
      auVar25[2] = cVar13;
      auVar25[3] = '@' - cVar13;
      auVar25[4] = cVar14;
      auVar25[5] = '@' - cVar14;
      auVar25[6] = cVar15;
      auVar25[7] = '@' - cVar15;
      auVar25[8] = cVar16;
      auVar25[9] = '@' - cVar16;
      auVar25[10] = cVar17;
      auVar25[0xb] = '@' - cVar17;
      auVar25[0xc] = cVar18;
      auVar25[0xd] = '@' - cVar18;
      auVar25[0xe] = cVar19;
      auVar25[0xf] = '@' - cVar19;
      auVar25 = pmaddubsw(auVar42,auVar25);
      auVar47 = pmulhrsw(auVar47,auVar21);
      auVar25 = pmulhrsw(auVar25,auVar21);
      sVar24 = auVar47._0_2_;
      sVar26 = auVar47._2_2_;
      sVar27 = auVar47._4_2_;
      sVar28 = auVar47._6_2_;
      sVar29 = auVar47._8_2_;
      sVar30 = auVar47._10_2_;
      sVar31 = auVar47._12_2_;
      sVar32 = auVar47._14_2_;
      sVar33 = auVar25._0_2_;
      sVar34 = auVar25._2_2_;
      sVar35 = auVar25._4_2_;
      sVar36 = auVar25._6_2_;
      sVar37 = auVar25._8_2_;
      sVar38 = auVar25._10_2_;
      sVar39 = auVar25._12_2_;
      sVar40 = auVar25._14_2_;
      puVar1 = dst + lVar23;
      *puVar1 = (0 < sVar24) * (sVar24 < 0x100) * auVar47[0] - (0xff < sVar24);
      puVar1[1] = (0 < sVar26) * (sVar26 < 0x100) * auVar47[2] - (0xff < sVar26);
      puVar1[2] = (0 < sVar27) * (sVar27 < 0x100) * auVar47[4] - (0xff < sVar27);
      puVar1[3] = (0 < sVar28) * (sVar28 < 0x100) * auVar47[6] - (0xff < sVar28);
      puVar1[4] = (0 < sVar29) * (sVar29 < 0x100) * auVar47[8] - (0xff < sVar29);
      puVar1[5] = (0 < sVar30) * (sVar30 < 0x100) * auVar47[10] - (0xff < sVar30);
      puVar1[6] = (0 < sVar31) * (sVar31 < 0x100) * auVar47[0xc] - (0xff < sVar31);
      puVar1[7] = (0 < sVar32) * (sVar32 < 0x100) * auVar47[0xe] - (0xff < sVar32);
      puVar1[8] = (0 < sVar33) * (sVar33 < 0x100) * auVar25[0] - (0xff < sVar33);
      puVar1[9] = (0 < sVar34) * (sVar34 < 0x100) * auVar25[2] - (0xff < sVar34);
      puVar1[10] = (0 < sVar35) * (sVar35 < 0x100) * auVar25[4] - (0xff < sVar35);
      puVar1[0xb] = (0 < sVar36) * (sVar36 < 0x100) * auVar25[6] - (0xff < sVar36);
      puVar1[0xc] = (0 < sVar37) * (sVar37 < 0x100) * auVar25[8] - (0xff < sVar37);
      puVar1[0xd] = (0 < sVar38) * (sVar38 < 0x100) * auVar25[10] - (0xff < sVar38);
      puVar1[0xe] = (0 < sVar39) * (sVar39 < 0x100) * auVar25[0xc] - (0xff < sVar39);
      puVar1[0xf] = (0 < sVar40) * (sVar40 < 0x100) * auVar25[0xe] - (0xff < sVar40);
    }
    dst = dst + dst_stride;
    src0 = src0 + src0_stride;
    src1 = src1 + src1_stride;
    mask = mask + mask_stride * 2;
    puVar22 = puVar22 + mask_stride * 2;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_sx_sy_w16n_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i v_zmask_b =
      _mm_set_epi8(0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1);
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  do {
    int c;
    for (c = 0; c < w; c += 16) {
      const __m128i v_ral_b = xx_loadu_128(mask + 2 * c);
      const __m128i v_rah_b = xx_loadu_128(mask + 2 * c + 16);
      const __m128i v_rbl_b = xx_loadu_128(mask + mask_stride + 2 * c);
      const __m128i v_rbh_b = xx_loadu_128(mask + mask_stride + 2 * c + 16);
      const __m128i v_rvsl_b = _mm_add_epi8(v_ral_b, v_rbl_b);
      const __m128i v_rvsh_b = _mm_add_epi8(v_rah_b, v_rbh_b);
      const __m128i v_rvsal_w = _mm_and_si128(v_rvsl_b, v_zmask_b);
      const __m128i v_rvsah_w = _mm_and_si128(v_rvsh_b, v_zmask_b);
      const __m128i v_rvsbl_w =
          _mm_and_si128(_mm_srli_si128(v_rvsl_b, 1), v_zmask_b);
      const __m128i v_rvsbh_w =
          _mm_and_si128(_mm_srli_si128(v_rvsh_b, 1), v_zmask_b);
      const __m128i v_rsl_w = _mm_add_epi16(v_rvsal_w, v_rvsbl_w);
      const __m128i v_rsh_w = _mm_add_epi16(v_rvsah_w, v_rvsbh_w);

      const __m128i v_m0l_w = xx_roundn_epu16(v_rsl_w, 2);
      const __m128i v_m0h_w = xx_roundn_epu16(v_rsh_w, 2);
      const __m128i v_m0_b = _mm_packus_epi16(v_m0l_w, v_m0h_w);
      const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

      const __m128i v_res_b =
          blend_16_u8(src0 + c, src1 + c, &v_m0_b, &v_m1_b, &_r);

      xx_storeu_128(dst + c, v_res_b);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}